

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PP_particle.cpp
# Opt level: O1

PP_particle * __thiscall
PP_particle::operator=(PP_particle *__return_storage_ptr__,PP_particle *this,PP_particle *c)

{
  PP_COORD PStack_48;
  PP_COORD local_30;
  
  PP_COORD::operator=(&local_30,&(this->super_PP_object).coord,&(c->super_PP_object).coord);
  PP_COORD::operator=(&PStack_48,&(this->super_PP_object).v,&(c->super_PP_object).v);
  (this->super_PP_object).R = (c->super_PP_object).R;
  this->m = c->m;
  this->e = c->e;
  PP_particle(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

PP_particle PP_particle::operator= (PP_particle & c)
{
    coord=c.coord;
    v=c.v;
    R=c.R;
    m=c.m;
    e=c.e;
    return *this;
}